

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Probe.cpp
# Opt level: O0

void __thiscall
helics::apps::Probe::Probe
          (Probe *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  Endpoint *in_RSI;
  char *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000001a8;
  App *in_stack_000001b0;
  undefined1 in_stack_000001b8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff98;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38 [2];
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffffb0,in_RDI);
  this_00 = local_38;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_RSI,in_stack_ffffffffffffff98);
  App::App(in_stack_000001b0,(string_view)in_stack_000001b8,in_stack_000001a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(this_00);
  *(undefined ***)in_RDI = &PTR__Probe_00a47720;
  Endpoint::Endpoint(in_RSI);
  in_RDI[0x118] = '\0';
  in_RDI[0x119] = '\0';
  in_RDI[0x11a] = '\0';
  in_RDI[0x11b] = '\0';
  in_RDI[0x11c] = '\0';
  in_RDI[0x11d] = '\0';
  in_RDI[0x11e] = '\0';
  in_RDI[0x11f] = '\0';
  return;
}

Assistant:

Probe::Probe(std::vector<std::string> args): App("probe_${#}", std::move(args)) {}